

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O3

void saucyGateWay(Abc_Ntk_t *pNtkOrig,Abc_Obj_t *pNodePo,FILE *gFile,int fBooleanMatching,
                 int fLookForSwaps,int fFixOutputs,int fFixInputs,int fQuiet,int fPrintTree)

{
  uint uVar1;
  undefined4 uVar2;
  uint uVar3;
  Abc_Obj_t *pNode;
  Vec_Int_t **ppVVar4;
  Vec_Int_t **ppVVar5;
  undefined1 auVar6 [16];
  byte bVar7;
  uint uVar8;
  clock_t cVar9;
  char *pcVar10;
  Abc_Ntk_t *pNtk;
  saucy *s;
  Vec_Ptr_t *pVVar11;
  Vec_Ptr_t *pVVar12;
  Vec_Ptr_t **ppVVar13;
  void **ppvVar14;
  int *piVar15;
  void *pvVar16;
  FILE *pFVar17;
  clock_t cVar18;
  Vec_Ptr_t *pVVar19;
  Vec_Int_t *pVVar20;
  ulong uVar21;
  code *pcVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  long *plVar26;
  long lVar27;
  size_t __size;
  byte *pbVar28;
  int iVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  saucy_stats stats;
  int local_68;
  saucy_stats local_50;
  long lVar35;
  
  cVar9 = clock();
  if (pNodePo == (Abc_Obj_t *)0x0) {
    pNtk = Abc_NtkDup(pNtkOrig);
  }
  else {
    pNode = (Abc_Obj_t *)pNodePo->pNtk->vObjs->pArray[*(pNodePo->vFanins).pArray];
    pcVar10 = Abc_ObjName(pNodePo);
    pNtk = Abc_NtkCreateCone(pNtkOrig,pNode,pcVar10,0);
  }
  if (pNtk->vPis->nSize == 0) {
    Abc_Print(0,"This output is not dependent on any input\n");
    Abc_NtkDelete(pNtk);
    return;
  }
  s = saucy_alloc(pNtk);
  printf("Build functional dependency graph (dependency stats are below) ... ");
  ppVVar4 = s->iDep;
  ppVVar5 = s->oDep;
  pVVar11 = Sim_ComputeFunSupp(pNtk,0);
  pVVar12 = pNtk->vPos;
  if (0 < pVVar12->nSize) {
    pVVar19 = pNtk->vPis;
    lVar24 = 0;
    do {
      if (0 < pVVar19->nSize) {
        pbVar28 = (byte *)pVVar11->pArray[lVar24];
        iVar29 = 0;
        do {
          bVar7 = *pbVar28;
          if ((bVar7 & 1) != 0) {
            Vec_IntPushOrder(ppVVar5[lVar24],iVar29);
            bVar7 = *pbVar28;
          }
          if ((bVar7 & 2) != 0) {
            Vec_IntPushOrder(ppVVar5[lVar24],iVar29 + 1);
            bVar7 = *pbVar28;
          }
          if ((bVar7 & 4) != 0) {
            Vec_IntPushOrder(ppVVar5[lVar24],iVar29 + 2);
            bVar7 = *pbVar28;
          }
          if ((bVar7 & 8) != 0) {
            Vec_IntPushOrder(ppVVar5[lVar24],iVar29 + 3);
            bVar7 = *pbVar28;
          }
          if ((bVar7 & 0x10) != 0) {
            Vec_IntPushOrder(ppVVar5[lVar24],iVar29 + 4);
            bVar7 = *pbVar28;
          }
          if ((bVar7 & 0x20) != 0) {
            Vec_IntPushOrder(ppVVar5[lVar24],iVar29 + 5);
            bVar7 = *pbVar28;
          }
          if ((bVar7 & 0x40) != 0) {
            Vec_IntPushOrder(ppVVar5[lVar24],iVar29 + 6);
            bVar7 = *pbVar28;
          }
          if ((char)bVar7 < '\0') {
            Vec_IntPushOrder(ppVVar5[lVar24],iVar29 + 7);
          }
          pbVar28 = pbVar28 + 1;
          iVar29 = iVar29 + 8;
          pVVar19 = pNtk->vPis;
        } while (iVar29 < pVVar19->nSize);
        pVVar12 = pNtk->vPos;
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 < pVVar12->nSize);
    if (0 < pVVar12->nSize) {
      lVar24 = 0;
      do {
        pVVar20 = ppVVar5[lVar24];
        if (0 < pVVar20->nSize) {
          lVar25 = 0;
          do {
            Vec_IntPush(ppVVar4[pVVar20->pArray[lVar25]],(int)lVar24);
            lVar25 = lVar25 + 1;
            pVVar20 = ppVVar5[lVar24];
          } while (lVar25 < pVVar20->nSize);
          pVVar12 = pNtk->vPos;
        }
        lVar24 = lVar24 + 1;
      } while (lVar24 < pVVar12->nSize);
    }
  }
  puts("\t--------------------");
  pVVar12 = pNtk->vPis;
  lVar24 = (long)pVVar12->nSize;
  ppVVar13 = (Vec_Ptr_t **)malloc(lVar24 * 8);
  if (0 < lVar24) {
    lVar25 = 0;
    do {
      pVVar11 = (Vec_Ptr_t *)malloc(0x10);
      pVVar11->nCap = 0x32;
      pVVar11->nSize = 0;
      ppvVar14 = (void **)malloc(400);
      pVVar11->pArray = ppvVar14;
      ppVVar13[lVar25] = pVVar11;
      lVar25 = lVar25 + 1;
    } while (lVar24 != lVar25);
  }
  pVVar11 = pNtk->vCis;
  if (0 < pVVar11->nSize) {
    lVar24 = 0;
    do {
      plVar26 = (long *)pVVar11->pArray[lVar24];
      if ((pNtk->vTravIds).pArray == (int *)0x0) {
        iVar29 = pNtk->vObjs->nSize;
        uVar30 = (long)iVar29 + 500;
        iVar23 = (int)uVar30;
        if ((pNtk->vTravIds).nCap < iVar23) {
          piVar15 = (int *)malloc(uVar30 * 4);
          (pNtk->vTravIds).pArray = piVar15;
          if (piVar15 == (int *)0x0) goto LAB_0030d9a7;
          (pNtk->vTravIds).nCap = iVar23;
        }
        else {
          piVar15 = (int *)0x0;
        }
        if (-500 < iVar29) {
          memset(piVar15,0,(uVar30 & 0xffffffff) << 2);
        }
        (pNtk->vTravIds).nSize = iVar23;
      }
      iVar29 = pNtk->nTravIds;
      pNtk->nTravIds = iVar29 + 1;
      if (0x3ffffffe < iVar29) {
        __assert_fail("p->nTravIds < (1<<30)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                      ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
      }
      lVar25 = *plVar26;
      uVar1 = *(uint *)(plVar26 + 2);
      uVar2 = *(undefined4 *)(lVar25 + 0xd8);
      iVar29 = *(int *)(lVar25 + 0xe4);
      if (iVar29 <= (int)uVar1) {
        lVar27 = (long)(int)uVar1 + 1;
        iVar23 = *(int *)(lVar25 + 0xe0);
        lVar35 = (long)iVar23 * 2;
        if ((int)uVar1 < (int)lVar35) {
          if (iVar23 <= (int)uVar1) {
            __size = (long)iVar23 << 3;
            if (*(void **)(lVar25 + 0xe8) == (void *)0x0) {
              pvVar16 = malloc(__size);
            }
            else {
              pvVar16 = realloc(*(void **)(lVar25 + 0xe8),__size);
            }
            *(void **)(lVar25 + 0xe8) = pvVar16;
joined_r0x0030d36a:
            if (pvVar16 == (void *)0x0) {
LAB_0030d9a7:
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            *(int *)(lVar25 + 0xe0) = (int)lVar35;
            iVar29 = *(int *)(lVar25 + 0xe4);
          }
        }
        else if (iVar23 <= (int)uVar1) {
          if (*(void **)(lVar25 + 0xe8) == (void *)0x0) {
            pvVar16 = malloc(lVar27 * 4);
          }
          else {
            pvVar16 = realloc(*(void **)(lVar25 + 0xe8),lVar27 * 4);
          }
          *(void **)(lVar25 + 0xe8) = pvVar16;
          lVar35 = lVar27;
          goto joined_r0x0030d36a;
        }
        if (iVar29 <= (int)uVar1) {
          memset((void *)((long)iVar29 * 4 + *(long *)(lVar25 + 0xe8)),0,
                 (ulong)(uVar1 - iVar29) * 4 + 4);
        }
        *(int *)(lVar25 + 0xe4) = (int)lVar27;
        iVar29 = (int)lVar27;
      }
      if (((int)uVar1 < 0) || (iVar29 <= (int)uVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(undefined4 *)(*(long *)(lVar25 + 0xe8) + (ulong)uVar1 * 4) = uVar2;
      if (*(int *)*plVar26 == 1) {
        plVar26 = *(long **)(*(long *)(*(long *)((int *)*plVar26 + 8) + 8) +
                            (long)*(int *)plVar26[6] * 8);
      }
      if (0 < *(int *)((long)plVar26 + 0x2c)) {
        pVVar12 = ppVVar13[lVar24];
        lVar25 = 0;
        do {
          Abc_NtkDfsReverse_rec
                    (*(Abc_Obj_t **)
                      (*(long *)(*(long *)(*plVar26 + 0x20) + 8) +
                      (long)*(int *)(plVar26[6] + lVar25 * 4) * 8),pVVar12);
          lVar25 = lVar25 + 1;
        } while (lVar25 < *(int *)((long)plVar26 + 0x2c));
      }
      lVar24 = lVar24 + 1;
      pVVar11 = pNtk->vCis;
    } while (lVar24 < pVVar11->nSize);
    pVVar12 = pNtk->vPis;
  }
  s->topOrder = ppVVar13;
  uVar1 = pNtk->vPos->nSize;
  uVar30 = (ulong)uVar1;
  uVar3 = pVVar12->nSize;
  piVar15 = (int *)malloc((long)(int)(uVar3 + uVar1) << 2);
  auVar6 = _DAT_0093d220;
  if (fFixOutputs == 0) {
    if (0 < (int)uVar1) {
      memset(piVar15,0,uVar30 * 4);
    }
  }
  else if (0 < (int)uVar1) {
    lVar24 = uVar30 - 1;
    auVar31._8_4_ = (int)lVar24;
    auVar31._0_8_ = lVar24;
    auVar31._12_4_ = (int)((ulong)lVar24 >> 0x20);
    uVar21 = 0;
    auVar31 = auVar31 ^ _DAT_0093d220;
    auVar38 = _DAT_0093d210;
    do {
      auVar37 = auVar38 ^ auVar6;
      if ((bool)(~(auVar37._4_4_ == auVar31._4_4_ && auVar31._0_4_ < auVar37._0_4_ ||
                  auVar31._4_4_ < auVar37._4_4_) & 1)) {
        piVar15[uVar21] = (int)uVar21;
      }
      if ((auVar37._12_4_ != auVar31._12_4_ || auVar37._8_4_ <= auVar31._8_4_) &&
          auVar37._12_4_ <= auVar31._12_4_) {
        piVar15[uVar21 + 1] = (int)uVar21 + 1;
      }
      uVar21 = uVar21 + 2;
      lVar24 = auVar38._8_8_;
      auVar38._0_8_ = auVar38._0_8_ + 2;
      auVar38._8_8_ = lVar24 + 2;
    } while ((uVar1 + 1 & 0xfffffffe) != uVar21);
  }
  auVar6 = _DAT_0093d220;
  lVar24 = (long)(int)uVar1;
  if (fFixInputs == 0) {
    uVar8 = 1;
    if (fFixOutputs != 0) {
      uVar8 = uVar1;
    }
    if (0 < (int)uVar3) {
      lVar25 = (ulong)uVar3 - 1;
      auVar33._8_4_ = (int)lVar25;
      auVar33._0_8_ = lVar25;
      auVar33._12_4_ = (int)((ulong)lVar25 >> 0x20);
      lVar25 = 0;
      auVar33 = auVar33 ^ _DAT_0093d220;
      auVar37 = _DAT_0093e4e0;
      auVar36 = _DAT_0093d210;
      do {
        auVar38 = auVar36 ^ auVar6;
        iVar29 = auVar33._4_4_;
        if ((bool)(~(auVar38._4_4_ == iVar29 && auVar33._0_4_ < auVar38._0_4_ ||
                    iVar29 < auVar38._4_4_) & 1)) {
          *(uint *)((long)piVar15 + lVar25 + lVar24 * 4) = uVar8;
        }
        if ((auVar38._12_4_ != auVar33._12_4_ || auVar38._8_4_ <= auVar33._8_4_) &&
            auVar38._12_4_ <= auVar33._12_4_) {
          *(uint *)((long)piVar15 + lVar25 + lVar24 * 4 + 4) = uVar8;
        }
        iVar23 = SUB164(auVar37 ^ auVar6,4);
        if (iVar23 <= iVar29 && (iVar23 != iVar29 || SUB164(auVar37 ^ auVar6,0) <= auVar33._0_4_)) {
          *(uint *)((long)piVar15 + lVar25 + lVar24 * 4 + 8) = uVar8;
          *(uint *)((long)piVar15 + lVar25 + lVar24 * 4 + 0xc) = uVar8;
        }
        lVar35 = auVar36._8_8_;
        auVar36._0_8_ = auVar36._0_8_ + 4;
        auVar36._8_8_ = lVar35 + 4;
        lVar35 = auVar37._8_8_;
        auVar37._0_8_ = auVar37._0_8_ + 4;
        auVar37._8_8_ = lVar35 + 4;
        lVar25 = lVar25 + 0x10;
      } while ((ulong)(uVar3 + 3 >> 2) << 4 != lVar25);
    }
  }
  else if (0 < (int)uVar3) {
    uVar21 = 1;
    if (fFixOutputs != 0) {
      uVar21 = uVar30;
    }
    lVar25 = (ulong)uVar3 - 1;
    auVar32._8_4_ = (int)lVar25;
    auVar32._0_8_ = lVar25;
    auVar32._12_4_ = (int)((ulong)lVar25 >> 0x20);
    lVar25 = 0;
    auVar32 = auVar32 ^ _DAT_0093d220;
    auVar34 = _DAT_0093d210;
    do {
      auVar38 = auVar34 ^ auVar6;
      iVar29 = (int)uVar21;
      if ((bool)(~(auVar38._4_4_ == auVar32._4_4_ && auVar32._0_4_ < auVar38._0_4_ ||
                  auVar32._4_4_ < auVar38._4_4_) & 1)) {
        *(int *)((long)piVar15 + lVar25 + lVar24 * 4) = iVar29;
      }
      if ((auVar38._12_4_ != auVar32._12_4_ || auVar38._8_4_ <= auVar32._8_4_) &&
          auVar38._12_4_ <= auVar32._12_4_) {
        *(int *)((long)piVar15 + lVar25 + lVar24 * 4 + 4) = iVar29 + 1;
      }
      lVar35 = auVar34._8_8_;
      auVar34._0_8_ = auVar34._0_8_ + 2;
      auVar34._8_8_ = lVar35 + 2;
      lVar25 = lVar25 + 8;
      uVar21 = (ulong)(iVar29 + 2);
    } while ((ulong)(uVar3 + 1 >> 1) << 3 != lVar25);
  }
  s->fBooleanMatching = fBooleanMatching;
  NUM_SIM1_ITERATION = 0x32;
  if (fBooleanMatching == 0) {
    NUM_SIM1_ITERATION = 200;
  }
  pcVar22 = print_automorphism_quiet;
  if (fQuiet == 0) {
    pcVar22 = print_automorphism_ntk;
  }
  NUM_SIM2_ITERATION = NUM_SIM1_ITERATION;
  s->print_automorphism = pcVar22;
  if (gFile == (FILE *)0x0) {
    gFile = (FILE *)_stdout;
  }
  s->gFile = gFile;
  s->fPrintTree = fPrintTree;
  s->fLookForSwaps = fLookForSwaps;
  saucy_search(pNtk,s,0,piVar15,&local_50);
  pFVar17 = _stdout;
  fprintf(_stdout,"group size = %fe%d\n",local_50.grpsize_base,(ulong)(uint)local_50.grpsize_exp);
  fprintf(pFVar17,"levels = %d\n",(ulong)(uint)local_50.levels);
  fprintf(pFVar17,"nodes = %d\n",(ulong)(uint)local_50.nodes);
  fprintf(pFVar17,"generators = %d\n",(ulong)(uint)local_50.gens);
  fprintf(pFVar17,"total support = %d\n",(ulong)(uint)local_50.support);
  fprintf(pFVar17,"average support = %.2f\n",(double)local_50.support / (double)local_50.gens);
  fprintf(pFVar17,"nodes per generator = %.2f\n",(double)local_50.nodes / (double)local_50.gens);
  fprintf(pFVar17,"bad nodes = %d\n",local_50.bads);
  if (fBooleanMatching != 0) {
    pcVar10 = "*** Networks are NOT equivalent ***";
    if (0 < local_50.grpsize_exp) {
      pcVar10 = "*** Networks are equivalent ***";
    }
    if (1.0 < local_50.grpsize_base) {
      pcVar10 = "*** Networks are equivalent ***";
    }
    puts(pcVar10);
  }
  saucy_free(s);
  Abc_NtkDelete(pNtk);
  pFVar17 = fopen("hadi.txt","a");
  fprintf(pFVar17,"group size = %fe%d\n",local_50.grpsize_base,(ulong)(uint)local_50.grpsize_exp);
  fclose(pFVar17);
  Abc_Print(1,"%s =","Runtime");
  cVar18 = clock();
  local_68 = (int)cVar9;
  Abc_Print(1,"%9.2f sec\n",(double)(cVar18 - local_68) / 1000000.0);
  return;
}

Assistant:

void saucyGateWay( Abc_Ntk_t * pNtkOrig, Abc_Obj_t * pNodePo, FILE * gFile, int fBooleanMatching, 
                   int fLookForSwaps, int fFixOutputs, int fFixInputs, int fQuiet, int fPrintTree )
{
    Abc_Ntk_t * pNtk;
    struct saucy *s;
    struct saucy_stats stats;
    int *colors;
    int i, clk = clock();   
    
    if (pNodePo == NULL)
        pNtk = Abc_NtkDup( pNtkOrig );
    else
        pNtk = Abc_NtkCreateCone( pNtkOrig, Abc_ObjFanin0(pNodePo), Abc_ObjName(pNodePo), 0 );
    
    if (Abc_NtkPiNum(pNtk) == 0) {
        Abc_Print( 0, "This output is not dependent on any input\n" );
        Abc_NtkDelete( pNtk );
        return;
    }

    s = saucy_alloc( pNtk );    

    /******* Getting Dependencies *******/  
    printf("Build functional dependency graph (dependency stats are below) ... ");      
    getDependencies( pNtk, s->iDep, s->oDep );
    printf("\t--------------------\n");
    /************************************/

    /* Finding toplogical orde */
    s->topOrder = findTopologicalOrder( pNtk );                 

    /* Setting graph colors: outputs = 0 and inputs = 1 */
    colors = ints(Abc_NtkPoNum(pNtk) + Abc_NtkPiNum(pNtk));
    if (fFixOutputs) {
        for (i = 0; i < Abc_NtkPoNum(pNtk); i++)
            colors[i] = i;
    } else {
        for (i = 0; i < Abc_NtkPoNum(pNtk); i++)
            colors[i] = 0;
    }
    if (fFixInputs) {
        int c = (fFixOutputs) ? Abc_NtkPoNum(pNtk) : 1;
        for (i = 0; i < Abc_NtkPiNum(pNtk); i++)
            colors[i+Abc_NtkPoNum(pNtk)] = c+i;     
    } else {
        int c = (fFixOutputs) ? Abc_NtkPoNum(pNtk) : 1;
        for (i = 0; i < Abc_NtkPiNum(pNtk); i++)
            colors[i+Abc_NtkPoNum(pNtk)] = c;   
    }   

    /* Are we looking for Boolean matching? */
    s->fBooleanMatching = fBooleanMatching;
    if (fBooleanMatching) {
        NUM_SIM1_ITERATION = 50;
        NUM_SIM2_ITERATION = 50;
    } else {
        NUM_SIM1_ITERATION = 200;
        NUM_SIM2_ITERATION = 200;
    }

    /* Set the print automorphism routine */
    if (!fQuiet)
        s->print_automorphism = print_automorphism_ntk;
    else
        s->print_automorphism = print_automorphism_quiet;

    /* Set the output file for generators */
    if (gFile == NULL)
        s->gFile = stdout;
    else
        s->gFile = gFile;

    /* Set print tree option */
    s->fPrintTree = fPrintTree;

    /* Set input permutations option */
    s->fLookForSwaps = fLookForSwaps;

    saucy_search(pNtk, s, 0, colors, &stats);   
    print_stats(stdout, stats);
    if (fBooleanMatching) {
        if (stats.grpsize_base > 1 || stats.grpsize_exp > 0)
            printf("*** Networks are equivalent ***\n");
        else
            printf("*** Networks are NOT equivalent ***\n");
    }
    saucy_free(s);
    Abc_NtkDelete(pNtk);

    if (1) {
        FILE * hadi = fopen("hadi.txt", "a");
        fprintf(hadi, "group size = %fe%d\n",
        stats.grpsize_base, stats.grpsize_exp); 
        fclose(hadi);
    }

    ABC_PRT( "Runtime", clock() - clk );

}